

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialaddress.cpp
# Opt level: O3

void __thiscall
ElementsConfidentialAddress_P2shWrappedP2wshAddressFromString_Test::TestBody
          (ElementsConfidentialAddress_P2shWrappedP2wshAddressFromString_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char *pcVar3;
  char *in_R9;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_4;
  ElementsConfidentialAddress address;
  AssertHelper local_3c0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3b8;
  string local_3b0;
  AssertHelper local_390;
  undefined1 local_388 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_380;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378 [23];
  pointer local_208;
  pointer local_1f8;
  _Alloc_hider local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  ElementsConfidentialAddress local_1d0;
  
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress(&local_1d0);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3b0,
                 "VJLBL3rkCh19CDi889GPXkn1BYqUih5DF2p8ViS2J4Tr2cnZNmgEuyWyLvABqzeNyjtqWNNx3NTXMxXp",
                 "");
      cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
                ((ElementsConfidentialAddress *)local_388,&local_3b0);
      cfd::core::ElementsConfidentialAddress::operator=
                (&local_1d0,(ElementsConfidentialAddress *)local_388);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_p != &local_1e0) {
        operator_delete(local_1f0._M_p,local_1e0._M_allocated_capacity + 1);
      }
      if (local_208 != (pointer)0x0) {
        operator_delete(local_208,(long)local_1f8 - (long)local_208);
      }
      cfd::core::Address::~Address((Address *)local_388);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
        operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_388);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x18a,
               "Expected: (address = ElementsConfidentialAddress( \"VJLBL3rkCh19CDi889GPXkn1BYqUih5DF2p8ViS2J4Tr2cnZNmgEuyWyLvABqzeNyjtqWNNx3NTXMxXp\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3b0,(Message *)local_388);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3b0);
    if (((CONCAT71(local_388._1_7_,local_388[0]) != 0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       ((long *)CONCAT71(local_388._1_7_,local_388[0]) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(local_388._1_7_,local_388[0]) + 8))();
    }
  }
  cfd::core::ElementsConfidentialAddress::GetAddress_abi_cxx11_((string *)local_388,&local_1d0);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_3b0,
             "\"VJLBL3rkCh19CDi889GPXkn1BYqUih5DF2p8ViS2J4Tr2cnZNmgEuyWyLvABqzeNyjtqWNNx3NTXMxXp\"",
             "address.GetAddress().c_str()",
             "VJLBL3rkCh19CDi889GPXkn1BYqUih5DF2p8ViS2J4Tr2cnZNmgEuyWyLvABqzeNyjtqWNNx3NTXMxXp",
             (char *)CONCAT71(local_388._1_7_,local_388[0]));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_388._1_7_,local_388[0]) != local_378) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_388._1_7_,local_388[0]),
                    (ulong)(local_378[0]._M_allocated_capacity + 1));
  }
  if ((char)local_3b0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_388);
    if ((undefined8 *)local_3b0._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_3b0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x18d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3c0,(Message *)local_388);
    testing::internal::AssertHelper::~AssertHelper(&local_3c0);
    if (((CONCAT71(local_388._1_7_,local_388[0]) != 0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       ((long *)CONCAT71(local_388._1_7_,local_388[0]) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(local_388._1_7_,local_388[0]) + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3b0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ElementsConfidentialAddress::GetConfidentialKey
            ((ConfidentialKey *)&local_3b0,&local_1d0);
  cfd::core::Pubkey::GetHex_abi_cxx11_((string *)local_388,(Pubkey *)&local_3b0);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_3c0,
             "\"02d570f84ffe5bdf7583400af2e6b9e219210ecf29a333757481cbca826ada8e16\"",
             "address.GetConfidentialKey().GetHex().c_str()",
             "02d570f84ffe5bdf7583400af2e6b9e219210ecf29a333757481cbca826ada8e16",
             (char *)CONCAT71(local_388._1_7_,local_388[0]));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_388._1_7_,local_388[0]) != local_378) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_388._1_7_,local_388[0]),
                    (ulong)(local_378[0]._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_3b0._M_dataplus._M_p,
                    local_3b0.field_2._M_allocated_capacity - (long)local_3b0._M_dataplus._M_p);
  }
  if (local_3c0.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_388);
    if (local_3b8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_3b8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,400,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3b0,(Message *)local_388);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3b0);
    if (((CONCAT71(local_388._1_7_,local_388[0]) != 0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       ((long *)CONCAT71(local_388._1_7_,local_388[0]) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(local_388._1_7_,local_388[0]) + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_3b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ElementsConfidentialAddress::GetHash((ByteData *)&local_3b0,&local_1d0);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_388,(ByteData *)&local_3b0);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_3c0,"\"258b7b985398033523194e96d9509bc04d011645\"",
             "address.GetHash().GetHex().c_str()","258b7b985398033523194e96d9509bc04d011645",
             (char *)CONCAT71(local_388._1_7_,local_388[0]));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_388._1_7_,local_388[0]) != local_378) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_388._1_7_,local_388[0]),
                    (ulong)(local_378[0]._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_3b0._M_dataplus._M_p,
                    local_3b0.field_2._M_allocated_capacity - (long)local_3b0._M_dataplus._M_p);
  }
  if (local_3c0.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_388);
    if (local_3b8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_3b8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x192,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3b0,(Message *)local_388);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3b0);
    if (((CONCAT71(local_388._1_7_,local_388[0]) != 0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       ((long *)CONCAT71(local_388._1_7_,local_388[0]) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(local_388._1_7_,local_388[0]) + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_3b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ElementsConfidentialAddress::GetUnblindedAddress((Address *)local_388,&local_1d0);
  cfd::core::Address::GetAddress_abi_cxx11_(&local_3b0,(Address *)local_388);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_3c0,"\"Gkc3VmVBsUoojntzW5zBvoETXm1zv6Bibz\"",
             "address.GetUnblindedAddress().GetAddress().c_str()",
             "Gkc3VmVBsUoojntzW5zBvoETXm1zv6Bibz",local_3b0._M_dataplus._M_p);
  paVar1 = &local_3b0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
  }
  cfd::core::Address::~Address((Address *)local_388);
  if (local_3c0.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_388);
    if (local_3b8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_3b8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x194,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3b0,(Message *)local_388);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3b0);
    if (((CONCAT71(local_388._1_7_,local_388[0]) != 0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       ((long *)CONCAT71(local_388._1_7_,local_388[0]) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(local_388._1_7_,local_388[0]) + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_3b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ElementsConfidentialAddress::GetAddress_abi_cxx11_((string *)local_388,&local_1d0);
  bVar2 = cfd::core::ElementsConfidentialAddress::IsConfidentialAddress((string *)local_388);
  local_3b0._M_dataplus._M_p._0_1_ = bVar2;
  local_3b0._M_string_length = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_388._1_7_,local_388[0]) == local_378) {
    if (!bVar2) goto LAB_00384984;
  }
  else {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_388._1_7_,local_388[0]),
                    (ulong)(local_378[0]._M_allocated_capacity + 1));
    if (((ulong)local_3b0._M_dataplus._M_p & 1) == 0) {
LAB_00384984:
      testing::Message::Message((Message *)&local_3c0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_388,(internal *)&local_3b0,
                 (AssertionResult *)
                 "ElementsConfidentialAddress::IsConfidentialAddress(address.GetAddress())","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_390,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
                 ,0x196,(char *)CONCAT71(local_388._1_7_,local_388[0]));
      testing::internal::AssertHelper::operator=(&local_390,(Message *)&local_3c0);
      testing::internal::AssertHelper::~AssertHelper(&local_390);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_388._1_7_,local_388[0]) != local_378) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_388._1_7_,local_388[0]),
                        (ulong)(local_378[0]._M_allocated_capacity + 1));
      }
      if (((CONCAT44(local_3c0.data_._4_4_,(ElementsNetType)local_3c0.data_) != 0) &&
          (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
         ((long *)CONCAT44(local_3c0.data_._4_4_,(ElementsNetType)local_3c0.data_) != (long *)0x0))
      {
        (**(code **)(*(long *)CONCAT44(local_3c0.data_._4_4_,(ElementsNetType)local_3c0.data_) + 8))
                  ();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3b0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3b0._M_dataplus._M_p._0_4_ = 3;
  local_3c0.data_._0_4_ = cfd::core::ElementsConfidentialAddress::GetNetType(&local_1d0);
  testing::internal::CmpHelperEQ<cfd::core::NetType,cfd::core::NetType>
            ((internal *)local_388,"ElementsNetType::kLiquidV1","address.GetNetType()",
             (NetType *)&local_3b0,(NetType *)&local_3c0);
  if (local_388[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3b0);
    if (local_380.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_380.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x197,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3c0,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3c0);
    if ((((long *)local_3b0._M_dataplus._M_p != (long *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       ((long *)local_3b0._M_dataplus._M_p != (long *)0x0)) {
      (**(code **)(*(long *)local_3b0._M_dataplus._M_p + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_380,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3b0._M_dataplus._M_p._0_4_ = 1;
  local_3c0.data_._0_4_ = cfd::core::ElementsConfidentialAddress::GetAddressType(&local_1d0);
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)local_388,"ElementsAddressType::kP2shAddress","address.GetAddressType()",
             (AddressType *)&local_3b0,(AddressType *)&local_3c0);
  if (local_388[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3b0);
    if (local_380.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_380.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x198,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3c0,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3c0);
    if ((((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) && (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0)) {
      (**(code **)(*(size_type *)local_3b0._M_dataplus._M_p + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_380,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_3b0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3b0,
                 "AzppkWN3gNvcnBu2Pm4Nsi8EdCmugMU2zjbpsMQZGBfMDmBauT4GvoJ5ZyZJP6p8rKYLor6JAdFoaoYJ",
                 "");
      cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
                ((ElementsConfidentialAddress *)local_388,&local_3b0);
      cfd::core::ElementsConfidentialAddress::operator=
                (&local_1d0,(ElementsConfidentialAddress *)local_388);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_p != &local_1e0) {
        operator_delete(local_1f0._M_p,local_1e0._M_allocated_capacity + 1);
      }
      if (local_208 != (pointer)0x0) {
        operator_delete(local_208,(long)local_1f8 - (long)local_208);
      }
      cfd::core::Address::~Address((Address *)local_388);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0._M_dataplus._M_p != paVar1) {
        operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_388);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x19d,
               "Expected: (address = ElementsConfidentialAddress( \"AzppkWN3gNvcnBu2Pm4Nsi8EdCmugMU2zjbpsMQZGBfMDmBauT4GvoJ5ZyZJP6p8rKYLor6JAdFoaoYJ\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3b0,(Message *)local_388);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3b0);
    if (((CONCAT71(local_388._1_7_,local_388[0]) != 0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       ((long *)CONCAT71(local_388._1_7_,local_388[0]) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(local_388._1_7_,local_388[0]) + 8))();
    }
  }
  cfd::core::ElementsConfidentialAddress::GetAddress_abi_cxx11_((string *)local_388,&local_1d0);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_3b0,
             "\"AzppkWN3gNvcnBu2Pm4Nsi8EdCmugMU2zjbpsMQZGBfMDmBauT4GvoJ5ZyZJP6p8rKYLor6JAdFoaoYJ\"",
             "address.GetAddress().c_str()",
             "AzppkWN3gNvcnBu2Pm4Nsi8EdCmugMU2zjbpsMQZGBfMDmBauT4GvoJ5ZyZJP6p8rKYLor6JAdFoaoYJ",
             (char *)CONCAT71(local_388._1_7_,local_388[0]));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_388._1_7_,local_388[0]) != local_378) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_388._1_7_,local_388[0]),
                    (ulong)(local_378[0]._M_allocated_capacity + 1));
  }
  if ((char)local_3b0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_388);
    if ((undefined8 *)local_3b0._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_3b0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x1a0,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3c0,(Message *)local_388);
    testing::internal::AssertHelper::~AssertHelper(&local_3c0);
    if (((CONCAT71(local_388._1_7_,local_388[0]) != 0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       ((long *)CONCAT71(local_388._1_7_,local_388[0]) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(local_388._1_7_,local_388[0]) + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3b0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ElementsConfidentialAddress::GetConfidentialKey
            ((ConfidentialKey *)&local_3b0,&local_1d0);
  cfd::core::Pubkey::GetHex_abi_cxx11_((string *)local_388,(Pubkey *)&local_3b0);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_3c0,
             "\"02d570f84ffe5bdf7583400af2e6b9e219210ecf29a333757481cbca826ada8e16\"",
             "address.GetConfidentialKey().GetHex().c_str()",
             "02d570f84ffe5bdf7583400af2e6b9e219210ecf29a333757481cbca826ada8e16",
             (char *)CONCAT71(local_388._1_7_,local_388[0]));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_388._1_7_,local_388[0]) != local_378) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_388._1_7_,local_388[0]),
                    (ulong)(local_378[0]._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_3b0._M_dataplus._M_p,
                    local_3b0.field_2._M_allocated_capacity - (long)local_3b0._M_dataplus._M_p);
  }
  if (local_3c0.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_388);
    if (local_3b8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_3b8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x1a3,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3b0,(Message *)local_388);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3b0);
    if (((CONCAT71(local_388._1_7_,local_388[0]) != 0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       ((long *)CONCAT71(local_388._1_7_,local_388[0]) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(local_388._1_7_,local_388[0]) + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_3b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ElementsConfidentialAddress::GetHash((ByteData *)&local_3b0,&local_1d0);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_388,(ByteData *)&local_3b0);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_3c0,"\"258b7b985398033523194e96d9509bc04d011645\"",
             "address.GetHash().GetHex().c_str()","258b7b985398033523194e96d9509bc04d011645",
             (char *)CONCAT71(local_388._1_7_,local_388[0]));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_388._1_7_,local_388[0]) != local_378) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_388._1_7_,local_388[0]),
                    (ulong)(local_378[0]._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_3b0._M_dataplus._M_p,
                    local_3b0.field_2._M_allocated_capacity - (long)local_3b0._M_dataplus._M_p);
  }
  if (local_3c0.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_388);
    if (local_3b8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_3b8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x1a5,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3b0,(Message *)local_388);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3b0);
    if (((CONCAT71(local_388._1_7_,local_388[0]) != 0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       ((long *)CONCAT71(local_388._1_7_,local_388[0]) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(local_388._1_7_,local_388[0]) + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_3b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ElementsConfidentialAddress::GetUnblindedAddress((Address *)local_388,&local_1d0);
  cfd::core::Address::GetAddress_abi_cxx11_(&local_3b0,(Address *)local_388);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_3c0,"\"XEmkwgDZRyVMBPv7PByfPK2nBvHxWJXpBQ\"",
             "address.GetUnblindedAddress().GetAddress().c_str()",
             "XEmkwgDZRyVMBPv7PByfPK2nBvHxWJXpBQ",local_3b0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
  }
  cfd::core::Address::~Address((Address *)local_388);
  if (local_3c0.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_388);
    if (local_3b8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_3b8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x1a7,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3b0,(Message *)local_388);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3b0);
    if (((CONCAT71(local_388._1_7_,local_388[0]) != 0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       ((long *)CONCAT71(local_388._1_7_,local_388[0]) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(local_388._1_7_,local_388[0]) + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_3b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ElementsConfidentialAddress::GetAddress_abi_cxx11_((string *)local_388,&local_1d0);
  bVar2 = cfd::core::ElementsConfidentialAddress::IsConfidentialAddress((string *)local_388);
  local_3b0._M_dataplus._M_p._0_1_ = bVar2;
  local_3b0._M_string_length = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_388._1_7_,local_388[0]) == local_378) {
    if (bVar2) goto LAB_00385215;
  }
  else {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_388._1_7_,local_388[0]),
                    (ulong)(local_378[0]._M_allocated_capacity + 1));
    if (((ulong)local_3b0._M_dataplus._M_p & 1) != 0) goto LAB_00385215;
  }
  testing::Message::Message((Message *)&local_3c0);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            ((string *)local_388,(internal *)&local_3b0,
             (AssertionResult *)
             "ElementsConfidentialAddress::IsConfidentialAddress(address.GetAddress())","false",
             "true",in_R9);
  testing::internal::AssertHelper::AssertHelper
            (&local_390,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
             ,0x1a9,(char *)CONCAT71(local_388._1_7_,local_388[0]));
  testing::internal::AssertHelper::operator=(&local_390,(Message *)&local_3c0);
  testing::internal::AssertHelper::~AssertHelper(&local_390);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_388._1_7_,local_388[0]) != local_378) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_388._1_7_,local_388[0]),
                    (ulong)(local_378[0]._M_allocated_capacity + 1));
  }
  if (((CONCAT44(local_3c0.data_._4_4_,(ElementsNetType)local_3c0.data_) != 0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     ((long *)CONCAT44(local_3c0.data_._4_4_,(ElementsNetType)local_3c0.data_) != (long *)0x0)) {
    (**(code **)(*(long *)CONCAT44(local_3c0.data_._4_4_,(ElementsNetType)local_3c0.data_) + 8))();
  }
LAB_00385215:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3b0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3b0._M_dataplus._M_p._0_4_ = 4;
  local_3c0.data_._0_4_ = cfd::core::ElementsConfidentialAddress::GetNetType(&local_1d0);
  testing::internal::CmpHelperEQ<cfd::core::NetType,cfd::core::NetType>
            ((internal *)local_388,"ElementsNetType::kElementsRegtest","address.GetNetType()",
             (NetType *)&local_3b0,(NetType *)&local_3c0);
  if (local_388[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3b0);
    if (local_380.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_380.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x1aa,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3c0,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3c0);
    if ((((long *)local_3b0._M_dataplus._M_p != (long *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       ((long *)local_3b0._M_dataplus._M_p != (long *)0x0)) {
      (**(code **)(*(long *)local_3b0._M_dataplus._M_p + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_380,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3b0._M_dataplus._M_p._0_4_ = 1;
  local_3c0.data_._0_4_ = cfd::core::ElementsConfidentialAddress::GetAddressType(&local_1d0);
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)local_388,"ElementsAddressType::kP2shAddress","address.GetAddressType()",
             (AddressType *)&local_3b0,(AddressType *)&local_3c0);
  if (local_388[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3b0);
    if (local_380.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_380.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x1ab,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3c0,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3c0);
    if ((((long *)local_3b0._M_dataplus._M_p != (long *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       ((long *)local_3b0._M_dataplus._M_p != (long *)0x0)) {
      (**(code **)(*(long *)local_3b0._M_dataplus._M_p + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_380,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0.address_._M_dataplus._M_p != &local_1d0.address_.field_2) {
    operator_delete(local_1d0.address_._M_dataplus._M_p,
                    local_1d0.address_.field_2._M_allocated_capacity + 1);
  }
  if (local_1d0.confidential_key_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d0.confidential_key_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1d0.confidential_key_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d0.confidential_key_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  cfd::core::Address::~Address(&local_1d0.unblinded_address_);
  return;
}

Assistant:

TEST(ElementsConfidentialAddress, P2shWrappedP2wshAddressFromString) {
  ElementsConfidentialAddress address;

  EXPECT_NO_THROW(
      (address =
          ElementsConfidentialAddress(
              "VJLBL3rkCh19CDi889GPXkn1BYqUih5DF2p8ViS2J4Tr2cnZNmgEuyWyLvABqzeNyjtqWNNx3NTXMxXp")));
  EXPECT_STREQ(
      "VJLBL3rkCh19CDi889GPXkn1BYqUih5DF2p8ViS2J4Tr2cnZNmgEuyWyLvABqzeNyjtqWNNx3NTXMxXp",
      address.GetAddress().c_str());
  EXPECT_STREQ(
      "02d570f84ffe5bdf7583400af2e6b9e219210ecf29a333757481cbca826ada8e16",
      address.GetConfidentialKey().GetHex().c_str());
  EXPECT_STREQ("258b7b985398033523194e96d9509bc04d011645",
               address.GetHash().GetHex().c_str());
  EXPECT_STREQ("Gkc3VmVBsUoojntzW5zBvoETXm1zv6Bibz",
               address.GetUnblindedAddress().GetAddress().c_str());
  EXPECT_TRUE(
      ElementsConfidentialAddress::IsConfidentialAddress(address.GetAddress()));
  EXPECT_EQ(ElementsNetType::kLiquidV1, address.GetNetType());
  EXPECT_EQ(ElementsAddressType::kP2shAddress, address.GetAddressType());

  EXPECT_NO_THROW(
      (address =
          ElementsConfidentialAddress(
              "AzppkWN3gNvcnBu2Pm4Nsi8EdCmugMU2zjbpsMQZGBfMDmBauT4GvoJ5ZyZJP6p8rKYLor6JAdFoaoYJ")));
  EXPECT_STREQ(
      "AzppkWN3gNvcnBu2Pm4Nsi8EdCmugMU2zjbpsMQZGBfMDmBauT4GvoJ5ZyZJP6p8rKYLor6JAdFoaoYJ",
      address.GetAddress().c_str());
  EXPECT_STREQ(
      "02d570f84ffe5bdf7583400af2e6b9e219210ecf29a333757481cbca826ada8e16",
      address.GetConfidentialKey().GetHex().c_str());
  EXPECT_STREQ("258b7b985398033523194e96d9509bc04d011645",
               address.GetHash().GetHex().c_str());
  EXPECT_STREQ("XEmkwgDZRyVMBPv7PByfPK2nBvHxWJXpBQ",
               address.GetUnblindedAddress().GetAddress().c_str());
  EXPECT_TRUE(
      ElementsConfidentialAddress::IsConfidentialAddress(address.GetAddress()));
  EXPECT_EQ(ElementsNetType::kElementsRegtest, address.GetNetType());
  EXPECT_EQ(ElementsAddressType::kP2shAddress, address.GetAddressType());
}